

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

SourceCodeInfo * __thiscall
google::protobuf::FileDescriptorProto::mutable_source_code_info(FileDescriptorProto *this)

{
  SourceCodeInfo *this_00;
  FileDescriptorProto *this_local;
  
  set_has_source_code_info(this);
  if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
    this_00 = (SourceCodeInfo *)operator_new(0x30);
    SourceCodeInfo::SourceCodeInfo(this_00);
    this->source_code_info_ = this_00;
  }
  return this->source_code_info_;
}

Assistant:

inline ::google::protobuf::SourceCodeInfo* FileDescriptorProto::mutable_source_code_info() {
  set_has_source_code_info();
  if (source_code_info_ == NULL) {
    source_code_info_ = new ::google::protobuf::SourceCodeInfo;
  }
  // @@protoc_insertion_point(field_mutable:google.protobuf.FileDescriptorProto.source_code_info)
  return source_code_info_;
}